

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall google::protobuf::Map<long,_double>::InnerMap::~InnerMap(InnerMap *this)

{
  if (this->table_ != (void **)0x0) {
    clear(this);
    Map<long,double>::InnerMap::Dealloc<void*>((InnerMap *)this,this->table_,this->num_buckets_);
  }
  return;
}

Assistant:

~InnerMap() {
      if (table_ != NULL) {
        clear();
        Dealloc<void*>(table_, num_buckets_);
      }
    }